

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool dxil_spv::Converter::entry_point_matches(String *mangled,char *user)

{
  bool bVar1;
  int iVar2;
  String local_38;
  
  bVar1 = is_mangled_entry_point(user);
  if (bVar1) {
    iVar2 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            compare(mangled,user);
  }
  else {
    demangle_entry_point(&local_38,mangled);
    iVar2 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            compare(&local_38,user);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      free_in_thread(local_38._M_dataplus._M_p);
    }
  }
  return iVar2 == 0;
}

Assistant:

bool Converter::entry_point_matches(const String &mangled, const char *user)
{
	if (is_mangled_entry_point(user))
		return mangled == user;
	else
		return demangle_entry_point(mangled) == user;
}